

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeFunction.cpp
# Opt level: O0

void __thiscall
Js::RuntimeFunction::MarkVisitKindSpecificPtrs(RuntimeFunction *this,SnapshotExtractor *extractor)

{
  Var this_00;
  int iVar1;
  void **ppvVar2;
  ScriptContext *pSVar3;
  RuntimeFunction *function;
  Var revokableProxy;
  SnapshotExtractor *extractor_local;
  RuntimeFunction *this_local;
  
  revokableProxy = extractor;
  extractor_local = (SnapshotExtractor *)this;
  ppvVar2 = Memory::WriteBarrierPtr::operator_cast_to_void__
                      ((WriteBarrierPtr *)&this->functionNameId);
  this_00 = revokableProxy;
  if (*ppvVar2 != (void *)0x0) {
    ppvVar2 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)&this->functionNameId);
    TTD::SnapshotExtractor::MarkVisitVar((SnapshotExtractor *)this_00,*ppvVar2);
  }
  function = (RuntimeFunction *)0x0;
  pSVar3 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  iVar1 = (*(this->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x14])
                    (this,this,0xd,&function,0,pSVar3);
  if (iVar1 != 0) {
    TTD::SnapshotExtractor::MarkVisitVar((SnapshotExtractor *)revokableProxy,function);
  }
  return;
}

Assistant:

void RuntimeFunction::MarkVisitKindSpecificPtrs(TTD::SnapshotExtractor* extractor)
    {
        if(this->functionNameId != nullptr)
        {
            extractor->MarkVisitVar(this->functionNameId);
        }

        Var revokableProxy = nullptr;
        RuntimeFunction* function = const_cast<RuntimeFunction*>(this);
        if(function->GetInternalProperty(function, Js::InternalPropertyIds::RevocableProxy, &revokableProxy, nullptr, this->GetScriptContext()))
        {
            extractor->MarkVisitVar(revokableProxy);
        }
    }